

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O1

mat4 * dja::mat4::homogeneous::rotation(mat4 *__return_storage_ptr__,vec3 *axis,float_t rad)

{
  float fVar1;
  quaternion local_48;
  float local_38;
  float fStack_34;
  float_t fStack_30;
  float fStack_2c;
  undefined4 uStack_28;
  float_t local_24;
  undefined8 local_20;
  float_t local_18;
  
  fVar1 = cosf(rad * 0.5);
  fStack_2c = sinf(rad * 0.5);
  fStack_34 = axis->x * fStack_2c;
  fStack_30 = axis->y * fStack_2c;
  fStack_2c = fStack_2c * axis->z;
  local_48.im.x = fStack_34;
  local_48.re = fVar1;
  local_48.im.z = fStack_2c;
  local_48.im.y = fStack_30;
  local_38 = fVar1;
  mat3::rotation(&local_48);
  __return_storage_ptr__->m[0].x = 0.0;
  __return_storage_ptr__->m[0].y = 0.0;
  __return_storage_ptr__->m[0].z = 0.0;
  __return_storage_ptr__->m[0].w = 0.0;
  __return_storage_ptr__->m[1].x = 0.0;
  __return_storage_ptr__->m[1].y = 0.0;
  __return_storage_ptr__->m[1].z = 0.0;
  __return_storage_ptr__->m[1].w = 0.0;
  __return_storage_ptr__->m[2].x = 0.0;
  __return_storage_ptr__->m[2].y = 0.0;
  __return_storage_ptr__->m[2].z = 0.0;
  __return_storage_ptr__->m[2].w = 0.0;
  __return_storage_ptr__->m[3].x = 0.0;
  __return_storage_ptr__->m[3].y = 0.0;
  __return_storage_ptr__->m[3].z = 0.0;
  __return_storage_ptr__->m[3].w = 0.0;
  __return_storage_ptr__->m[0].x = local_38;
  __return_storage_ptr__->m[0].y = fStack_34;
  __return_storage_ptr__->m[0].z = fStack_30;
  __return_storage_ptr__->m[0].w = 0.0;
  __return_storage_ptr__->m[1].x = fStack_2c;
  __return_storage_ptr__->m[1].y = (float_t)uStack_28;
  __return_storage_ptr__->m[1].z = local_24;
  __return_storage_ptr__->m[1].w = 0.0;
  __return_storage_ptr__->m[2].x = (float_t)(undefined4)local_20;
  __return_storage_ptr__->m[2].y = (float_t)local_20._4_4_;
  __return_storage_ptr__->m[2].z = local_18;
  *(undefined8 *)&__return_storage_ptr__->m[2].w = 0;
  __return_storage_ptr__->m[3].y = 0.0;
  __return_storage_ptr__->m[3].z = 0.0;
  __return_storage_ptr__->m[3].w = 1.0;
  return __return_storage_ptr__;
}

Assistant:

mat4 mat4::homogeneous::rotation(const vec3& axis, float_t rad)
{
    return mat4::homogeneous::from_mat3(mat3::rotation(axis, rad));
}